

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cutNode.c
# Opt level: O0

Cut_Cut_t * Cut_NodeUnionCuts(Cut_Man_t *p,Vec_Int_t *vNodes)

{
  uint uVar1;
  int Node_00;
  int iVar2;
  abctime aVar3;
  Cut_Cut_t *pCVar4;
  abctime aVar5;
  Cut_Cut_t *local_1c0;
  Cut_Cut_t *local_1b8;
  Cut_Cut_t *local_1b0;
  Cut_Cut_t *local_1a0;
  Cut_Cut_t *local_198;
  Cut_Cut_t *local_190;
  Cut_Cut_t *local_180;
  Cut_Cut_t *local_178;
  Cut_Cut_t *local_170;
  Cut_Cut_t *local_158;
  Cut_Cut_t *local_150;
  Cut_Cut_t *local_148;
  abctime clk;
  int Limit;
  int Root;
  int Node;
  int k;
  int i;
  Cut_Cut_t *pTop;
  Cut_Cut_t *pCut2;
  Cut_Cut_t *pCut;
  Cut_Cut_t *pListStart;
  Cut_Cut_t *pList;
  Cut_List_t *pSuper;
  Cut_List_t Super;
  Vec_Int_t *vNodes_local;
  Cut_Man_t *p_local;
  
  _k = (Cut_Cut_t *)0x0;
  uVar1 = p->pParams->nVarsMax;
  Super.ppTail[0xc] = (Cut_Cut_t **)vNodes;
  aVar3 = Abc_Clock();
  Cut_ListStart((Cut_List_t *)&pSuper);
  Node_00 = Vec_IntEntry((Vec_Int_t *)Super.ppTail[0xc],0);
  p->nNodeCuts = 1;
  Vec_PtrClear(p->vTemp);
  for (Node = 0; iVar2 = Vec_IntSize((Vec_Int_t *)Super.ppTail[0xc]), Node < iVar2; Node = Node + 1)
  {
    iVar2 = Vec_IntEntry((Vec_Int_t *)Super.ppTail[0xc],Node);
    pCVar4 = Cut_NodeReadCutsNew(p,iVar2);
    Cut_NodeWriteCutsNew(p,iVar2,(Cut_Cut_t *)0x0);
    if (pCVar4 == (Cut_Cut_t *)0x0) {
      __assert_fail("pList",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/cut/cutNode.c"
                    ,700,"Cut_Cut_t *Cut_NodeUnionCuts(Cut_Man_t *, Vec_Int_t *)");
    }
    pCut2 = pCVar4->pNext;
    pCVar4->pNext = (Cut_Cut_t *)0x0;
    if (Node == 0) {
      Cut_ListAdd((Cut_List_t *)&pSuper,pCVar4);
      _k = pCVar4;
    }
    else {
      Cut_CutRecycle(p,pCVar4);
    }
    if (pCut2 == (Cut_Cut_t *)0x0) {
      local_148 = (Cut_Cut_t *)0x0;
    }
    else {
      local_148 = pCut2->pNext;
    }
    pTop = local_148;
    while (pCut2 != (Cut_Cut_t *)0x0) {
      if (*(uint *)pCut2 >> 0x1c == uVar1) {
        Vec_PtrPush(p->vTemp,pCut2);
        break;
      }
      if ((p->pParams->fFilter == 0) ||
         (iVar2 = Cut_CutFilterOne(p,(Cut_List_t *)&pSuper,pCut2), iVar2 == 0)) {
        *(uint *)pCut2 =
             *(uint *)pCut2 & 0xff7fffff |
             (*(uint *)_k >> 0x16 & 1 ^ *(uint *)pCut2 >> 0x16 & 1) << 0x17;
        pCVar4 = pCut2->pNext;
        pCut2->pNext = (Cut_Cut_t *)0x0;
        Cut_ListAdd((Cut_List_t *)&pSuper,pCut2);
        iVar2 = p->nNodeCuts + 1;
        p->nNodeCuts = iVar2;
        if (iVar2 == p->pParams->nKeepMax) {
          if (pCVar4 == (Cut_Cut_t *)0x0) {
            local_150 = (Cut_Cut_t *)0x0;
          }
          else {
            local_150 = pCVar4->pNext;
          }
          pTop = local_150;
          pCut2 = pCVar4;
          while (Root = Node, pCut2 != (Cut_Cut_t *)0x0) {
            Cut_CutRecycle(p,pCut2);
            pCut2 = pTop;
            if (pTop == (Cut_Cut_t *)0x0) {
              local_158 = (Cut_Cut_t *)0x0;
            }
            else {
              local_158 = pTop->pNext;
            }
            pTop = local_158;
          }
          while( true ) {
            Root = Root + 1;
            iVar2 = Vec_IntSize((Vec_Int_t *)Super.ppTail[0xc]);
            if (iVar2 <= Root) break;
            iVar2 = Vec_IntEntry((Vec_Int_t *)Super.ppTail[0xc],Root);
            Cut_NodeFreeCuts(p,iVar2);
          }
          for (Root = 0; iVar2 = Vec_PtrSize(p->vTemp), Root < iVar2; Root = Root + 1) {
            pCut2 = (Cut_Cut_t *)Vec_PtrEntry(p->vTemp,Root);
            if (pCut2 == (Cut_Cut_t *)0x0) {
              local_170 = (Cut_Cut_t *)0x0;
            }
            else {
              local_170 = pCut2->pNext;
            }
            pTop = local_170;
            while (pCut2 != (Cut_Cut_t *)0x0) {
              Cut_CutRecycle(p,pCut2);
              pCut2 = pTop;
              if (pTop == (Cut_Cut_t *)0x0) {
                local_178 = (Cut_Cut_t *)0x0;
              }
              else {
                local_178 = pTop->pNext;
              }
              pTop = local_178;
            }
          }
          goto LAB_005495fe;
        }
      }
      pCut2 = pTop;
      if (pTop == (Cut_Cut_t *)0x0) {
        local_180 = (Cut_Cut_t *)0x0;
      }
      else {
        local_180 = pTop->pNext;
      }
      pTop = local_180;
    }
  }
  Node = 0;
  do {
    iVar2 = Vec_PtrSize(p->vTemp);
    if (iVar2 <= Node) {
LAB_005495fe:
      pCVar4 = Cut_NodeReadCutsNew(p,Node_00);
      if (pCVar4 == (Cut_Cut_t *)0x0) {
        pCVar4 = Cut_ListFinish((Cut_List_t *)&pSuper);
        Cut_NodeWriteCutsNew(p,Node_00,pCVar4);
        aVar5 = Abc_Clock();
        p->timeUnion = (aVar5 - aVar3) + p->timeUnion;
        p->nNodes = p->nNodes - (*(int *)((long)Super.ppTail[0xc] + 4) + -1);
        return pCVar4;
      }
      __assert_fail("Cut_NodeReadCutsNew(p, Root) == NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/cut/cutNode.c"
                    ,0x303,"Cut_Cut_t *Cut_NodeUnionCuts(Cut_Man_t *, Vec_Int_t *)");
    }
    pCut2 = (Cut_Cut_t *)Vec_PtrEntry(p->vTemp,Node);
    if (pCut2 == (Cut_Cut_t *)0x0) {
      local_190 = (Cut_Cut_t *)0x0;
    }
    else {
      local_190 = pCut2->pNext;
    }
    pTop = local_190;
    while (pCut2 != (Cut_Cut_t *)0x0) {
      if ((p->pParams->fFilter == 0) ||
         (iVar2 = Cut_CutFilterOne(p,(Cut_List_t *)&pSuper,pCut2), iVar2 == 0)) {
        *(uint *)pCut2 =
             *(uint *)pCut2 & 0xff7fffff |
             (*(uint *)_k >> 0x16 & 1 ^ *(uint *)pCut2 >> 0x16 & 1) << 0x17;
        pCVar4 = pCut2->pNext;
        pCut2->pNext = (Cut_Cut_t *)0x0;
        Cut_ListAdd((Cut_List_t *)&pSuper,pCut2);
        iVar2 = p->nNodeCuts + 1;
        p->nNodeCuts = iVar2;
        if (iVar2 == p->pParams->nKeepMax) {
          if (pCVar4 == (Cut_Cut_t *)0x0) {
            local_198 = (Cut_Cut_t *)0x0;
          }
          else {
            local_198 = pCVar4->pNext;
          }
          pTop = local_198;
          pCut2 = pCVar4;
          while (pCut2 != (Cut_Cut_t *)0x0) {
            Cut_CutRecycle(p,pCut2);
            pCut2 = pTop;
            if (pTop == (Cut_Cut_t *)0x0) {
              local_1a0 = (Cut_Cut_t *)0x0;
            }
            else {
              local_1a0 = pTop->pNext;
            }
            pTop = local_1a0;
          }
          while( true ) {
            Root = Node + 1;
            iVar2 = Vec_PtrSize(p->vTemp);
            if (iVar2 <= Root) break;
            pCut2 = (Cut_Cut_t *)Vec_PtrEntry(p->vTemp,Root);
            if (pCut2 == (Cut_Cut_t *)0x0) {
              local_1b0 = (Cut_Cut_t *)0x0;
            }
            else {
              local_1b0 = pCut2->pNext;
            }
            pTop = local_1b0;
            while (Node = Root, pCut2 != (Cut_Cut_t *)0x0) {
              Cut_CutRecycle(p,pCut2);
              pCut2 = pTop;
              if (pTop == (Cut_Cut_t *)0x0) {
                local_1b8 = (Cut_Cut_t *)0x0;
              }
              else {
                local_1b8 = pTop->pNext;
              }
              pTop = local_1b8;
            }
          }
          goto LAB_005495fe;
        }
      }
      pCut2 = pTop;
      if (pTop == (Cut_Cut_t *)0x0) {
        local_1c0 = (Cut_Cut_t *)0x0;
      }
      else {
        local_1c0 = pTop->pNext;
      }
      pTop = local_1c0;
    }
    Node = Node + 1;
  } while( true );
}

Assistant:

Cut_Cut_t * Cut_NodeUnionCuts( Cut_Man_t * p, Vec_Int_t * vNodes )
{
    Cut_List_t Super, * pSuper = &Super;
    Cut_Cut_t * pList, * pListStart, * pCut, * pCut2;
    Cut_Cut_t * pTop = NULL; // Suppress "might be used uninitialized"
    int i, k, Node, Root, Limit = p->pParams->nVarsMax;
    abctime clk = Abc_Clock();

    // start the new list
    Cut_ListStart( pSuper );

    // remember the root node to save the resulting cuts
    Root = Vec_IntEntry( vNodes, 0 );
    p->nNodeCuts = 1;

    // collect small cuts first
    Vec_PtrClear( p->vTemp );
    Vec_IntForEachEntry( vNodes, Node, i )
    {
        // get the cuts of this node
        pList = Cut_NodeReadCutsNew( p, Node );
        Cut_NodeWriteCutsNew( p, Node, NULL );
        assert( pList );
        // remember the starting point
        pListStart = pList->pNext;
        pList->pNext = NULL;
        // save or recycle the elementary cut
        if ( i == 0 )
            Cut_ListAdd( pSuper, pList ), pTop = pList;
        else
            Cut_CutRecycle( p, pList );
        // save all the cuts that are smaller than the limit
        Cut_ListForEachCutSafe( pListStart, pCut, pCut2 )
        {
            if ( pCut->nLeaves == (unsigned)Limit )
            {
                Vec_PtrPush( p->vTemp, pCut );
                break;
            }
            // check containment
            if ( p->pParams->fFilter && Cut_CutFilterOne( p, pSuper, pCut ) )
                continue;
            // set the complemented bit by comparing the first cut with the current cut
            pCut->fCompl = pTop->fSimul ^ pCut->fSimul;
            pListStart = pCut->pNext;
            pCut->pNext = NULL;
            // add to the list
            Cut_ListAdd( pSuper, pCut );
            if ( ++p->nNodeCuts == p->pParams->nKeepMax )
            {
                // recycle the rest of the cuts of this node
                Cut_ListForEachCutSafe( pListStart, pCut, pCut2 )
                    Cut_CutRecycle( p, pCut );
                // recycle all cuts of other nodes
                Vec_IntForEachEntryStart( vNodes, Node, k, i+1 )
                    Cut_NodeFreeCuts( p, Node );
                // recycle the saved cuts of other nodes
                Vec_PtrForEachEntry( Cut_Cut_t *, p->vTemp, pList, k )
                    Cut_ListForEachCutSafe( pList, pCut, pCut2 )
                        Cut_CutRecycle( p, pCut );
                goto finish;
            }
        }
    } 
    // collect larger cuts next
    Vec_PtrForEachEntry( Cut_Cut_t *, p->vTemp, pList, i )
    {
        Cut_ListForEachCutSafe( pList, pCut, pCut2 )
        {
            // check containment
            if ( p->pParams->fFilter && Cut_CutFilterOne( p, pSuper, pCut ) )
                continue;
            // set the complemented bit
            pCut->fCompl = pTop->fSimul ^ pCut->fSimul;
            pListStart = pCut->pNext;
            pCut->pNext = NULL;
            // add to the list
            Cut_ListAdd( pSuper, pCut );
            if ( ++p->nNodeCuts == p->pParams->nKeepMax )
            {
                // recycle the rest of the cuts
                Cut_ListForEachCutSafe( pListStart, pCut, pCut2 )
                    Cut_CutRecycle( p, pCut );
                // recycle the saved cuts of other nodes
                Vec_PtrForEachEntryStart( Cut_Cut_t *, p->vTemp, pList, k, i+1 )
                    Cut_ListForEachCutSafe( pList, pCut, pCut2 )
                        Cut_CutRecycle( p, pCut );
                goto finish;
            }
        }
    }
finish :
    // set the cuts at the node
    assert( Cut_NodeReadCutsNew(p, Root) == NULL );
    pList = Cut_ListFinish( pSuper );
    Cut_NodeWriteCutsNew( p, Root, pList );
p->timeUnion += Abc_Clock() - clk;
    // filter the cuts
//clk = Abc_Clock();
//    if ( p->pParams->fFilter )
//        Cut_CutFilter( p, pList );
//p->timeFilter += Abc_Clock() - clk;
    p->nNodes -= vNodes->nSize - 1;
    return pList;
}